

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Write3dmDimStyle(ON_BinaryArchive *this,ON_DimStyle *dimstyle)

{
  bool bVar1;
  uint uVar2;
  ON_DimStyle *this_00;
  ON_UUID *a;
  bool local_59;
  ON_UUID local_44;
  ON_DimStyle *local_28;
  ON_DimStyle *copy_of_model_dimstyle;
  ON_DimStyle *dimstyle_local;
  ON_BinaryArchive *this_local;
  
  copy_of_model_dimstyle = dimstyle;
  dimstyle_local = (ON_DimStyle *)this;
  bVar1 = ON_ModelComponent::ParentIdIsNotNil(&dimstyle->super_ON_ModelComponent);
  if ((bVar1) || (bVar1 = ON_DimStyle::HasOverrides(copy_of_model_dimstyle), bVar1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2a10,"","Override dimstyles are not stored in the dimstyle table in V6 files.");
  }
  else {
    if (this->m_archive_dim_style_table_status == 1) {
      uVar2 = ON_SimpleArray<ON_DimStyle_*>::UnsignedCount(&this->m_archive_dim_style_table);
      if (uVar2 != 0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2a18,"","Write3dmDimStyle() called at the incorrect time");
        return false;
      }
      this->m_archive_dim_style_table_status = 2;
    }
    else if ((this->m_archive_dim_style_table_status == 2) &&
            (uVar2 = ON_SimpleArray<ON_DimStyle_*>::UnsignedCount(&this->m_archive_dim_style_table),
            uVar2 == 0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x2a21,"","Write3dmDimStyle() called at the incorrect time");
      return false;
    }
    this_00 = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle::ON_DimStyle(this_00,copy_of_model_dimstyle);
    if (this_00 != (ON_DimStyle *)0x0) {
      local_28 = this_00;
      Internal_Write3dmUpdateManifest(this,(ON_ModelComponent *)this_00);
      ON_SimpleArray<ON_DimStyle_*>::Append(&this->m_archive_dim_style_table,&local_28);
      if ((this->m_archive_current_dim_style == (ON_DimStyle *)0x0) &&
         (this->m_archive_3dm_settings != (ON_3dmSettings *)0x0)) {
        bVar1 = ON_ModelComponent::IdIsNotNil(&copy_of_model_dimstyle->super_ON_ModelComponent);
        local_59 = false;
        if (bVar1) {
          a = ON_ModelComponent::Id(&copy_of_model_dimstyle->super_ON_ModelComponent);
          local_44 = ON_3dmSettings::CurrentDimensionStyleId(this->m_archive_3dm_settings);
          local_59 = ::operator==(a,&local_44);
        }
        if (local_59 != false) {
          this->m_archive_current_dim_style = local_28;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ON_BinaryArchive::Write3dmDimStyle( const ON_DimStyle&  dimstyle )
{
  if ( dimstyle.ParentIdIsNotNil() || dimstyle.HasOverrides())
  {
    ON_ERROR("Override dimstyles are not stored in the dimstyle table in V6 files.");
    return true; // don't abort writing the file.
  }

  if (1 == m_archive_dim_style_table_status)
  {
    if (0 != m_archive_dim_style_table.UnsignedCount())
    {
      ON_ERROR("Write3dmDimStyle() called at the incorrect time");
      return false;
    }
    m_archive_dim_style_table_status = 2;
  }
  else if (2 == m_archive_dim_style_table_status)
  {
    if (m_archive_dim_style_table.UnsignedCount() <= 0 )
    {
      ON_ERROR("Write3dmDimStyle() called at the incorrect time");
      return false;
    }
  }

  ON_DimStyle* copy_of_model_dimstyle = new ON_DimStyle(dimstyle);
  if (nullptr != copy_of_model_dimstyle)
  {
    Internal_Write3dmUpdateManifest(*copy_of_model_dimstyle);
    m_archive_dim_style_table.Append(copy_of_model_dimstyle);
    if (nullptr == m_archive_current_dim_style)
    {
      if (nullptr != m_archive_3dm_settings)
      {
        if (dimstyle.IdIsNotNil() && dimstyle.Id() == m_archive_3dm_settings->CurrentDimensionStyleId())
          m_archive_current_dim_style = copy_of_model_dimstyle;
      }
    }
  }

  return true;
}